

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O3

int Abc_AigNodeIsAcyclic(Abc_Obj_t *pNode,Abc_Obj_t *pRoot)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  uint uVar6;
  char *__assertion;
  
  if (((ulong)pNode & 1) == 0) {
    if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
      iVar5 = 1;
      if ((pNode->vFanins).nSize == 2) {
        piVar1 = (pNode->vFanins).pArray;
        ppvVar2 = pNode->pNtk->vObjs->pArray;
        pAVar3 = (Abc_Obj_t *)ppvVar2[*piVar1];
        iVar5 = 0;
        if ((pAVar3 != pRoot) &&
           (pAVar4 = (Abc_Obj_t *)ppvVar2[piVar1[1]], iVar5 = 0, pAVar4 != pRoot)) {
          uVar6 = *(uint *)&pAVar3->field_0x14 & 0xf;
          if ((uVar6 != 2) && (uVar6 != 5)) {
            piVar1 = (pAVar3->vFanins).pArray;
            ppvVar2 = pAVar3->pNtk->vObjs->pArray;
            if ((Abc_Obj_t *)ppvVar2[*piVar1] == pRoot) {
              return 0;
            }
            if ((Abc_Obj_t *)ppvVar2[piVar1[1]] == pRoot) {
              return 0;
            }
          }
          uVar6 = *(uint *)&pAVar4->field_0x14 & 0xf;
          if ((uVar6 != 2) && (uVar6 != 5)) {
            piVar1 = (pAVar4->vFanins).pArray;
            ppvVar2 = pAVar4->pNtk->vObjs->pArray;
            if ((Abc_Obj_t *)ppvVar2[*piVar1] == pRoot) {
              return 0;
            }
            if ((Abc_Obj_t *)ppvVar2[piVar1[1]] == pRoot) {
              return 0;
            }
          }
          iVar5 = 1;
        }
      }
      return iVar5;
    }
    __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
  }
  else {
    __assertion = "!Abc_ObjIsComplement(pNode)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

int Abc_AigNodeIsAcyclic( Abc_Obj_t * pNode, Abc_Obj_t * pRoot )
{
    Abc_Obj_t * pFanin0, * pFanin1;
    Abc_Obj_t * pChild00, * pChild01;
    Abc_Obj_t * pChild10, * pChild11;
    if ( !Abc_AigNodeIsAnd(pNode) )
        return 1;
    pFanin0 = Abc_ObjFanin0(pNode);
    pFanin1 = Abc_ObjFanin1(pNode);
    if ( pRoot == pFanin0 || pRoot == pFanin1 )
        return 0;
    if ( Abc_ObjIsCi(pFanin0) )
    {
        pChild00 = NULL;
        pChild01 = NULL;
    }
    else
    {
        pChild00 = Abc_ObjFanin0(pFanin0);
        pChild01 = Abc_ObjFanin1(pFanin0);
        if ( pRoot == pChild00 || pRoot == pChild01 )
            return 0;
    }
    if ( Abc_ObjIsCi(pFanin1) )
    {
        pChild10 = NULL;
        pChild11 = NULL;
    }
    else
    {
        pChild10 = Abc_ObjFanin0(pFanin1);
        pChild11 = Abc_ObjFanin1(pFanin1);
        if ( pRoot == pChild10 || pRoot == pChild11 )
            return 0;
    }
    return 1;
}